

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O0

void __thiscall bidfx_public_api::tools::Date::Date(Date *this,int year,int month,int day)

{
  bool bVar1;
  invalid_argument *this_00;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string error;
  int day_local;
  int month_local;
  int year_local;
  Date *this_local;
  
  error.field_2._12_4_ = day;
  bVar1 = IsValidDate(this,year,month,day);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,"Date is invalid: ",&local_41);
    std::allocator<char>::~allocator(&local_41);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ToString_abi_cxx11_(&local_98,this);
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_98);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this->year_ = year;
  this->month_ = month;
  this->day_ = error.field_2._12_4_;
  return;
}

Assistant:

Date::Date(int year, int month, int day)
{
    if (IsValidDate(year, month, day))
    {
        year_ = year;
        month_ = month;
        day_ = day;
    }
    else
    {
        std::string error = "Date is invalid: ";

        throw std::invalid_argument(error + ToString());
    }
}